

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

bool __thiscall Rml::Context::Render(Context *this)

{
  Vector2i VVar1;
  Vector2i VVar2;
  Vector2f offset;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  RenderManager::PrepareRender(this->render_manager,this->dimensions);
  Element::Render((this->root)._M_t.
                  super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                  super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
  if (this->drag_clone != (Element *)0x0) {
    ElementDocument::UpdateDocument
              ((ElementDocument *)
               (this->cursor_proxy)._M_t.
               super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
               super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
    VVar1 = this->mouse_position;
    VVar2 = this->dimensions;
    auVar4._8_8_ = 0;
    auVar4._0_4_ = VVar2.x;
    auVar4._4_4_ = VVar2.y;
    auVar6._0_8_ = CONCAT44(-(uint)(VVar1.y < VVar2.y),-(uint)(VVar1.x < VVar2.x));
    auVar6._8_8_ = 0;
    auVar5._0_4_ = -(uint)(VVar1.x < 0);
    auVar5._4_4_ = -(uint)((long)VVar1 < 0);
    auVar5._8_8_ = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (ulong)VVar1 & auVar6._0_8_;
    auVar3 = ~auVar5 & (~auVar6 & auVar4 | auVar3);
    offset.x = (float)auVar3._0_4_;
    offset.y = (float)auVar3._4_4_;
    Element::SetOffset((this->cursor_proxy)._M_t.
                       super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,offset,
                       (Element *)0x0,false);
    Element::Render((this->cursor_proxy)._M_t.
                    super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                    super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                    super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
  }
  RenderManager::ResetState(this->render_manager);
  return true;
}

Assistant:

bool Context::Render()
{
	RMLUI_ZoneScoped;

	render_manager->PrepareRender(dimensions);

	root->Render();

	// Render the cursor proxy so that any attached drag clone will be rendered below the cursor.
	if (drag_clone)
	{
		static_cast<ElementDocument&>(*cursor_proxy).UpdateDocument();
		cursor_proxy->SetOffset(
			Vector2f((float)Math::Clamp(mouse_position.x, 0, dimensions.x), (float)Math::Clamp(mouse_position.y, 0, dimensions.y)), nullptr);
		cursor_proxy->Render();
	}

	render_manager->ResetState();

	return true;
}